

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O2

void __thiscall
level_tools::register_sector_item
          (level_tools *this,uint16_t sector_idx,char *scene_object,string *mesh)

{
  value_type pxVar1;
  pointer pcVar2;
  reference ppxVar3;
  undefined6 in_register_00000032;
  sector_item local_60;
  
  ppxVar3 = std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
            at(this->m_scene_sectors,CONCAT62(in_register_00000032,sector_idx) & 0xffffffff);
  pxVar1 = *ppxVar3;
  local_60.object._M_dataplus._M_p = (pointer)&local_60.object.field_2;
  local_60.mesh._M_string_length = 0;
  local_60.mesh.field_2._8_8_ = 0;
  local_60.object.field_2._M_allocated_capacity = 0;
  local_60.object.field_2._8_8_ = 0;
  local_60.object._M_string_length = 0;
  local_60.mesh._M_dataplus._M_p = (pointer)&local_60.mesh.field_2;
  local_60.mesh.field_2._M_allocated_capacity = 0;
  std::vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>::
  emplace_back<xray_re::sector_item>
            ((vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_> *)
             &pxVar1[1].m_class_id,&local_60);
  xray_re::sector_item::~sector_item(&local_60);
  pcVar2 = pxVar1[1].m_name._M_dataplus._M_p;
  make_object_ref(this,(string *)(pcVar2 + -0x40),scene_object);
  std::__cxx11::string::_M_assign((string *)(pcVar2 + -0x20));
  return;
}

Assistant:

void level_tools::register_sector_item(uint16_t sector_idx, const char* scene_object, std::string& mesh)
{
	xr_sector_object* sector = static_cast<xr_sector_object*>(m_scene_sectors->at(sector_idx));
	sector->items().push_back(sector_item());
	sector_item* item = &sector->items().back();
	make_object_ref(item->object, scene_object);
	item->mesh = mesh;
}